

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_nearby_voice_dir_path(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  size_t sVar2;
  char *in_RSI;
  long in_RDI;
  char **d_1;
  char parent [260];
  char **d;
  char temp [260];
  char *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  char **path_00;
  char local_238 [264];
  char **local_130;
  char local_128 [280];
  long local_10;
  
  if (((in_RDI != 0) && (in_RSI != (char *)0x0)) &&
     (local_10 = in_RDI, sVar2 = strlen(in_RSI), sVar2 != 0)) {
    clear_path_string(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
    for (local_130 = G_DEFAULT_VOICE_DIR_NAMES; *local_130 != (char *)0x0; local_130 = local_130 + 1
        ) {
      _Var1 = search_directory(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(char *)0x193249)
      ;
      if (_Var1) goto LAB_001932e5;
    }
    get_dir_path(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    sVar2 = strlen(local_238);
    if (sVar2 != 0) {
      for (path_00 = G_DEFAULT_VOICE_DIR_NAMES; *path_00 != (char *)0x0; path_00 = path_00 + 1) {
        _Var1 = search_directory((char *)path_00,in_stack_fffffffffffffdb8,(char *)0x1932bf);
        if (_Var1) {
LAB_001932e5:
          strcpy((char *)(local_10 + 0x10c),local_128);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool set_nearby_voice_dir_path(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return false;
	}

	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// 指定位置から可能性のあるフォルダを探す
	for (const char **d = G_DEFAULT_VOICE_DIR_NAMES; *d != NULL; d++)
	{
		if (search_directory(path, *d, temp))
		{
			goto return_true;
		}
	}

	// その親ディレクトリから可能性のあるフォルダを探す
	char parent[MAX_PATH];
	get_dir_path(path, parent);
	if (parent != NULL && strlen(parent) != 0)
	{
		for (const char **d = G_DEFAULT_VOICE_DIR_NAMES; *d != NULL; d++)
		{
			if (search_directory(parent, *d, temp))
			{
				goto return_true;
			}
		}
	}
	return false;

return_true:
	strcpy(oj->dn_voice_dir_path, temp);
	return true;
}